

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::SimpleFormatter::formatAndAppend
          (SimpleFormatter *this,UnicodeString **values,int32_t valuesLength,UnicodeString *appendTo
          ,int32_t *offsets,int32_t offsetsLength,UErrorCode *errorCode)

{
  short sVar1;
  int32_t iVar2;
  char16_t *compiledPattern;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-1 < valuesLength) && (values != (UnicodeString **)0x0 || valuesLength == 0)) {
      if ((-1 < offsetsLength) &&
         ((offsets != (int32_t *)0x0 || offsetsLength == 0 &&
          (iVar2 = getArgumentLimit(this), iVar2 <= valuesLength)))) {
        compiledPattern = UnicodeString::getBuffer(&this->compiledPattern);
        sVar1 = (this->compiledPattern).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar2 = (this->compiledPattern).fUnion.fFields.fLength;
        }
        else {
          iVar2 = (int)sVar1 >> 5;
        }
        format(compiledPattern,iVar2,values,appendTo,(UnicodeString *)0x0,'\x01',offsets,
               offsetsLength,errorCode);
        return appendTo;
      }
    }
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return appendTo;
}

Assistant:

UnicodeString& SimpleFormatter::formatAndAppend(
        const UnicodeString *const *values, int32_t valuesLength,
        UnicodeString &appendTo,
        int32_t *offsets, int32_t offsetsLength, UErrorCode &errorCode) const {
    if (U_FAILURE(errorCode)) {
        return appendTo;
    }
    if (isInvalidArray(values, valuesLength) || isInvalidArray(offsets, offsetsLength) ||
            valuesLength < getArgumentLimit()) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }
    return format(compiledPattern.getBuffer(), compiledPattern.length(), values,
                  appendTo, NULL, TRUE,
                  offsets, offsetsLength, errorCode);
}